

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O1

_Bool PPC_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  byte bVar1;
  cs_detail *__s;
  DecodeStatus DVar2;
  uint16_t uVar3;
  uint uVar4;
  uint uVar5;
  int feature;
  uint64_t Address;
  
  feature = (int)size;
  uVar3 = 0;
  DVar2 = MCDisassembler_Fail;
  if (code_len < 4) goto LAB_0021fb59;
  if (instr->csh->mode < CS_MODE_ARM) {
    uVar4 = (uint)code[1] << 0x10 | (uint)*code << 0x18;
    uVar5 = (uint)code[2] << 8 | uVar4;
    code = code + 3;
  }
  else {
    uVar4 = (uint)code[2] << 0x10 | (uint)code[3] << 0x18;
    uVar5 = (uint)code[1] << 8 | uVar4;
  }
  Address = (uint64_t)uVar4;
  bVar1 = *code;
  __s = instr->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x128);
  }
  if ((instr->csh->mode & CS_MODE_M680X_6801) == CS_MODE_ARM) {
LAB_0021fb32:
    DVar2 = decodeInstruction_4("\x01\x1a\x06\x02",instr,uVar5 | bVar1,Address,feature);
    if (DVar2 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      uVar3 = 0;
      DVar2 = MCDisassembler_Fail;
      goto LAB_0021fb59;
    }
  }
  else {
    DVar2 = decodeInstruction_4(DecoderTableQPX32,instr,uVar5 | bVar1,Address,feature);
    if (DVar2 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      goto LAB_0021fb32;
    }
  }
  uVar3 = 4;
LAB_0021fb59:
  *size = uVar3;
  return DVar2 == MCDisassembler_Success;
}

Assistant:

bool PPC_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = getInstruction(instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}